

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_InvalidInput6_Test::TestBody(Manifold_InvalidInput6_Test *this)

{
  pointer *this_00;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_188;
  Message local_180;
  Error local_178;
  Error local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  Manifold local_108 [8];
  Manifold tet;
  undefined1 local_f8 [8];
  MeshGL tetGL;
  Manifold_InvalidInput6_Test *this_local;
  
  tetGL._224_8_ = this;
  TetGL();
  this_00 = &tetGL.vertProperties.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,sVar3 - 1);
  *pvVar4 = 7;
  manifold::Manifold::Manifold(local_108,(MeshGLP *)local_f8);
  bVar1 = manifold::Manifold::IsEmpty();
  local_129 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_128,(AssertionResult *)"tet.IsEmpty()"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x9a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_174 = manifold::Manifold::Status();
  local_178 = VertexOutOfBounds;
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_170,"tet.Status()","Manifold::Error::VertexOutOfBounds",&local_174,
             &local_178);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x9b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  manifold::Manifold::~Manifold(local_108);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_f8);
  return;
}

Assistant:

TEST(Manifold, InvalidInput6) {
  MeshGL tetGL = TetGL();
  tetGL.triVerts[tetGL.triVerts.size() - 1] = 7;
  Manifold tet(tetGL);
  EXPECT_TRUE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::VertexOutOfBounds);
}